

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

void do_cntp(DisasContext_conflict1 *s,TCGv_i64 val,int esz,int pn,int pg)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr pTVar1;
  uint uVar2;
  int iVar3;
  uint32_t val_00;
  TCGv_i64 ret;
  TCGv_ptr r;
  TCGv_ptr r_00;
  TCGv_i32 arg3;
  TCGv_i32 t_desc;
  uint desc;
  TCGv_ptr t_pg;
  TCGv_ptr t_pn;
  TCGv_i64 g;
  uint64_t psz_mask;
  uint psz;
  TCGContext_conflict1 *tcg_ctx;
  int pg_local;
  int pn_local;
  int esz_local;
  TCGv_i64 val_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = pred_full_reg_size(s);
  if (uVar2 < 9) {
    pTVar1 = tcg_ctx_00->cpu_env;
    iVar3 = pred_full_reg_offset(s,pn);
    tcg_gen_ld_i64_aarch64(tcg_ctx_00,val,pTVar1,(long)iVar3);
    if (pn != pg) {
      ret = tcg_temp_new_i64(tcg_ctx_00);
      pTVar1 = tcg_ctx_00->cpu_env;
      iVar3 = pred_full_reg_offset(s,pg);
      tcg_gen_ld_i64_aarch64(tcg_ctx_00,ret,pTVar1,(long)iVar3);
      tcg_gen_and_i64_aarch64(tcg_ctx_00,val,val,ret);
      tcg_temp_free_i64(tcg_ctx_00,ret);
    }
    tcg_gen_andi_i64_aarch64
              (tcg_ctx_00,val,val,
               pred_esz_masks_aarch64[esz] &
               0xffffffffffffffffU >> (0x40U - (char)(uVar2 << 3) & 0x3f));
    tcg_gen_ctpop_i64_aarch64(tcg_ctx_00,val,val);
  }
  else {
    r = tcg_temp_new_ptr(tcg_ctx_00);
    r_00 = tcg_temp_new_ptr(tcg_ctx_00);
    val_00 = deposit32(uVar2 - 2,10,2,esz);
    pTVar1 = tcg_ctx_00->cpu_env;
    iVar3 = pred_full_reg_offset(s,pn);
    tcg_gen_addi_ptr(tcg_ctx_00,r,pTVar1,(long)iVar3);
    pTVar1 = tcg_ctx_00->cpu_env;
    iVar3 = pred_full_reg_offset(s,pg);
    tcg_gen_addi_ptr(tcg_ctx_00,r_00,pTVar1,(long)iVar3);
    arg3 = tcg_const_i32_aarch64(tcg_ctx_00,val_00);
    gen_helper_sve_cntp(tcg_ctx_00,val,r,r_00,arg3);
    tcg_temp_free_ptr(tcg_ctx_00,r);
    tcg_temp_free_ptr(tcg_ctx_00,r_00);
    tcg_temp_free_i32(tcg_ctx_00,arg3);
  }
  return;
}

Assistant:

static void do_cntp(DisasContext *s, TCGv_i64 val, int esz, int pn, int pg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned psz = pred_full_reg_size(s);

    if (psz <= 8) {
        uint64_t psz_mask;

        tcg_gen_ld_i64(tcg_ctx, val, tcg_ctx->cpu_env, pred_full_reg_offset(s, pn));
        if (pn != pg) {
            TCGv_i64 g = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_ld_i64(tcg_ctx, g, tcg_ctx->cpu_env, pred_full_reg_offset(s, pg));
            tcg_gen_and_i64(tcg_ctx, val, val, g);
            tcg_temp_free_i64(tcg_ctx, g);
        }

        /* Reduce the pred_esz_masks value simply to reduce the
         * size of the code generated here.
         */
        psz_mask = MAKE_64BIT_MASK(0, psz * 8);
        tcg_gen_andi_i64(tcg_ctx, val, val, pred_esz_masks[esz] & psz_mask);

        tcg_gen_ctpop_i64(tcg_ctx, val, val);
    } else {
        TCGv_ptr t_pn = tcg_temp_new_ptr(tcg_ctx);
        TCGv_ptr t_pg = tcg_temp_new_ptr(tcg_ctx);
        unsigned desc;
        TCGv_i32 t_desc;

        desc = psz - 2;
        desc = deposit32(desc, SIMD_DATA_SHIFT, 2, esz);

        tcg_gen_addi_ptr(tcg_ctx, t_pn, tcg_ctx->cpu_env, pred_full_reg_offset(s, pn));
        tcg_gen_addi_ptr(tcg_ctx, t_pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, pg));
        t_desc = tcg_const_i32(tcg_ctx, desc);

        gen_helper_sve_cntp(tcg_ctx, val, t_pn, t_pg, t_desc);
        tcg_temp_free_ptr(tcg_ctx, t_pn);
        tcg_temp_free_ptr(tcg_ctx, t_pg);
        tcg_temp_free_i32(tcg_ctx, t_desc);
    }
}